

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntryIfd8Array(TIFF *tif,TIFFDirEntry *direntry,uint64_t **value)

{
  uint64_t uVar1;
  TIFFReadDirEntryErr TVar2;
  uint64_t *puVar3;
  long lVar4;
  uint64_t *lp;
  uint32_t count;
  void *origdata;
  uint local_44;
  uint64_t **local_40;
  uint64_t *local_38;
  
  TVar2 = TIFFReadDirEntryErrType;
  if ((direntry->tdir_type < 0x13) && ((0x52010U >> (direntry->tdir_type & 0x1f) & 1) != 0)) {
    TVar2 = TIFFReadDirEntryArrayWithLimit(tif,direntry,&local_44,8,&local_38,0xffffffffffffffff);
    if (local_38 == (uint64_t *)0x0 || TVar2 != TIFFReadDirEntryErrOk) {
      *value = (uint64_t *)0x0;
    }
    else if ((direntry->tdir_type | 2) == 0x12) {
      *value = local_38;
      TVar2 = TIFFReadDirEntryErrOk;
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabArrayOfLong8(local_38,(ulong)local_44);
      }
    }
    else {
      puVar3 = (uint64_t *)_TIFFmallocExt(tif,(ulong)(local_44 * 8));
      if (puVar3 == (uint64_t *)0x0) {
        _TIFFfreeExt(tif,local_38);
        TVar2 = TIFFReadDirEntryErrAlloc;
      }
      else {
        local_40 = value;
        if (((direntry->tdir_type == 0xd) || (direntry->tdir_type == 4)) && (local_44 != 0)) {
          lVar4 = 0;
          lp = local_38;
          do {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong((uint32_t *)lp);
            }
            uVar1 = *lp;
            lp = (uint64_t *)((long)lp + 4);
            puVar3[lVar4] = (ulong)(uint)uVar1;
            lVar4 = lVar4 + 1;
          } while (local_44 != (uint)lVar4);
        }
        _TIFFfreeExt(tif,local_38);
        *local_40 = puVar3;
        TVar2 = TIFFReadDirEntryErrOk;
      }
    }
  }
  return TVar2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryIfd8Array(TIFF *tif, TIFFDirEntry *direntry, uint64_t **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    uint64_t *data;
    switch (direntry->tdir_type)
    {
        case TIFF_LONG:
        case TIFF_LONG8:
        case TIFF_IFD:
        case TIFF_IFD8:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 8, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_LONG8:
        case TIFF_IFD8:
            *value = (uint64_t *)origdata;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong8(*value, count);
            return (TIFFReadDirEntryErrOk);
    }
    data = (uint64_t *)_TIFFmallocExt(tif, count * 8);
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_LONG:
        case TIFF_IFD:
        {
            uint32_t *ma;
            uint64_t *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                *mb++ = (uint64_t)(*ma++);
            }
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    *value = data;
    return (TIFFReadDirEntryErrOk);
}